

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BrAdd_Test::TestBody(InterpreterTestSuite_PC_BrAdd_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  undefined8 *puVar4;
  bool bVar5;
  Status SVar6;
  pointer *__ptr;
  _func_int **message;
  char *pcVar7;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_7;
  Network nwk;
  BorderRouterArray brs;
  uint64_t xpan;
  Expression expr;
  string brJson;
  DomainArray doms;
  NetworkArray nwks;
  Value value;
  TestContext ctx;
  string local_318;
  Error local_2f8;
  AssertHelper local_2c8;
  undefined8 *local_2c0;
  undefined1 local_2b8 [8];
  _Alloc_hider local_2b0;
  undefined1 local_2a8 [8];
  char local_2a0 [16];
  _Alloc_hider local_290 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  char local_270 [24];
  BorderRouterArray local_258;
  unsigned_long local_238;
  ErrorCode local_230;
  ErrorCode local_22c;
  Expression local_228;
  string local_208;
  DomainArray local_1e8;
  NetworkArray local_1c8;
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  size_type local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "[\n    {\n        \"Addr\": \"1234::5679\",\n        \"Port\": 2001,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": \"0x1235\",\n        \"DomainName\": \"dom1\"\n    },\n    {\n        \"Addr\": \"1234::5670\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": \"0x1235\",\n        \"DomainName\": \"dom1\"\n    },\n    {\n        \"Addr\": \"1234::5671\",\n        \"Port\": 2001,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net3\",\n        \"ExtendedPanId\": \"0x0000000000001236\",\n        \"DomainName\": \"dom3\"\n    }\n]"
             ,"");
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._0_4_ = kNone;
  local_198 = 0;
  local_190._M_local_buf[0] = '\0';
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  paVar1 = &local_318.field_2;
  local_318._M_dataplus._M_p = (pointer)paVar1;
  local_1a0._M_p = (pointer)&local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_2b8,&local_208,&local_318);
  puVar2 = (undefined8 *)&local_2f8.mMessage.field_2;
  local_2f8._0_8_ = (ulong)(uint)local_2f8._4_4_ << 0x20;
  local_2f8.mMessage._M_string_length = 0;
  local_2f8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2f8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_258,"WriteFile(brJson, \"./tmp/json.json\")","Error{}",
             (Error *)local_2b8,&local_2f8);
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2f8.mMessage._M_dataplus._M_p);
  }
  if (local_2b0._M_p != local_2a0) {
    operator_delete(local_2b0._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_258.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_2b8);
    if (local_258.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      message = (_func_int **)0x308a15;
    }
    else {
      message = (local_258.
                 super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_vptr_BorderRouter;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9c8,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_2b8 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_2b8 + 8))();
    }
  }
  if (local_258.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if ((BorderAgent *)
        (local_258.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_finish)->_vptr_BorderRouter !=
        &(local_258.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_finish)->mAgent) {
      operator_delete((local_258.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->_vptr_BorderRouter);
    }
    operator_delete(local_258.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8 = (undefined1  [8])local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_318,&local_160.mInterpreter,(string *)local_2b8);
  local_2f8.mMessage._M_string_length =
       (size_type)
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2f8.mMessage._M_dataplus._M_p =
       (pointer)local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2f8._0_8_ =
       local_228.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_318._M_dataplus._M_p;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_318._M_string_length;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_318.field_2._M_allocated_capacity;
  local_318._M_dataplus._M_p = (pointer)0x0;
  local_318._M_string_length = 0;
  local_318.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_318);
  if (local_2b8 != (undefined1  [8])local_2a8) {
    operator_delete((void *)local_2b8);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_2b8,&local_160.mInterpreter,&local_228);
  local_1a8._0_4_ = local_2b8._0_4_;
  std::__cxx11::string::operator=((string *)&local_1a0,(string *)&local_2b0);
  std::__cxx11::string::operator=((string *)&local_180,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290[0]._M_p != &local_280) {
    operator_delete(local_290[0]._M_p);
  }
  if (local_2b0._M_p != local_2a0) {
    operator_delete(local_2b0._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_1a8);
  local_2f8.mCode._0_1_ = bVar5;
  local_2f8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2b8,(internal *)&local_2f8,(AssertionResult *)0x2e6ffe,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9cb,(char *)local_2b8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_258,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_258);
    if (local_2b8 != (undefined1  [8])local_2a8) {
      operator_delete((void *)local_2b8);
    }
    if ((long *)local_318._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_318._M_dataplus._M_p + 8))();
    }
  }
  _Var3._M_p = local_2f8.mMessage._M_dataplus._M_p;
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2f8.mMessage._M_dataplus._M_p != local_2f8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2f8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar6 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                    (local_160.mInterpreter.mRegistry.
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_258);
  local_2f8.mCode._0_1_ = SVar6;
  local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)local_2b8,"ctx.mInterpreter.mRegistry->GetAllBorderRouters(brs)",
             "RegistryStatus::kSuccess",(Status *)&local_2f8,(Status *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9ce,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_2f8._0_8_ =
       ((long)local_258.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_258.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7d6343eb1a1f58d1;
  local_318._M_dataplus._M_p._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2b8,"brs.size()","3",(unsigned_long *)&local_2f8,(int *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9cf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_1c8.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar6 = ot::commissioner::persistent_storage::Registry::GetAllNetworks
                    (local_160.mInterpreter.mRegistry.
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_1c8);
  local_2f8.mCode._0_1_ = SVar6;
  local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)local_2b8,"ctx.mInterpreter.mRegistry->GetAllNetworks(nwks)",
             "RegistryStatus::kSuccess",(Status *)&local_2f8,(Status *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9d2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_2f8._0_8_ =
       ((long)local_1c8.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1c8.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  local_318._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2b8,"nwks.size()","2",(unsigned_long *)&local_2f8,(int *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9d3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_1e8.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar6 = ot::commissioner::persistent_storage::Registry::GetAllDomains
                    (local_160.mInterpreter.mRegistry.
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_1e8);
  local_2f8.mCode._0_1_ = SVar6;
  local_318._M_dataplus._M_p = local_318._M_dataplus._M_p & 0xffffffffffffff00;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)local_2b8,"ctx.mInterpreter.mRegistry->GetAllDomains(doms)",
             "RegistryStatus::kSuccess",(Status *)&local_2f8,(Status *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9d6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_2f8._0_8_ =
       ((long)local_1e8.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1e8.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_318._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2b8,"doms.size()","2",(unsigned_long *)&local_2f8,(int *)&local_318);
  if (local_2b8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2b0._M_p == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2b0._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9d7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  _Var3._M_p = local_2b0._M_p;
  if (local_2b0._M_p != (char *)0x0) {
    if (*(char **)local_2b0._M_p != local_2b0._M_p + 0x10) {
      operator_delete(*(char **)local_2b0._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  ot::commissioner::persistent_storage::Network::Network((Network *)local_2b8);
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"0x1235","");
  ot::commissioner::utils::ParseInteger<unsigned_long>(&local_2f8,&local_238,&local_318);
  local_22c = local_2f8.mCode;
  local_230 = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&local_2c8,"utils::ParseInteger(xpan, \"0x1235\").GetCode()",
             "ErrorCode::kNone",&local_22c,&local_230);
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2f8.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_2c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2c0 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_2c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9db,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  puVar4 = local_2c0;
  if (local_2c0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
      operator_delete((undefined8 *)*local_2c0);
    }
    operator_delete(puVar4);
  }
  SVar6 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    (local_160.mInterpreter.mRegistry.
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,0x1235,(Network *)local_2b8);
  local_318._M_dataplus._M_p._0_1_ = SVar6;
  local_2c8.data_._0_1_ = (internal)0x0;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&local_2f8,"ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1235, nwk)",
             "RegistryStatus::kSuccess",(Status *)&local_318,(Status *)&local_2c8);
  if ((internal)(undefined1)local_2f8.mCode == (internal)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_2f8.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2f8.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9dc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if ((long *)local_318._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_318._M_dataplus._M_p + 8))();
    }
  }
  _Var3._M_p = local_2f8.mMessage._M_dataplus._M_p;
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2f8.mMessage._M_dataplus._M_p != local_2f8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2f8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_2f8,"nwk.mXpan","xpan",(unsigned_long *)local_290,&local_238);
  if ((internal)(undefined1)local_2f8.mCode == (internal)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_2f8.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2f8.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9dd,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if ((long *)local_318._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_318._M_dataplus._M_p + 8))();
    }
  }
  _Var3._M_p = local_2f8.mMessage._M_dataplus._M_p;
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2f8.mMessage._M_dataplus._M_p != local_2f8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2f8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  local_318._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"0x0000000000001236","");
  ot::commissioner::utils::ParseInteger<unsigned_long>(&local_2f8,&local_238,&local_318);
  local_22c = local_2f8.mCode;
  local_230 = kNone;
  testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
            ((internal *)&local_2c8,"utils::ParseInteger(xpan, \"0x0000000000001236\").GetCode()",
             "ErrorCode::kNone",&local_22c,&local_230);
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2f8.mMessage._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != paVar1) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if (local_2c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if (local_2c0 == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (char *)*local_2c0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9de,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_318,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_318);
    if ((AssertHelperData *)local_2f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_2f8._0_8_ + 8))();
    }
  }
  if (local_2c0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
      operator_delete((undefined8 *)*local_2c0);
    }
    operator_delete(local_2c0);
  }
  SVar6 = ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
                    (local_160.mInterpreter.mRegistry.
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,0x1236,(Network *)local_2b8);
  local_318._M_dataplus._M_p._0_1_ = SVar6;
  local_2c8.data_._0_1_ = (internal)0x0;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&local_2f8,"ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1236, nwk)",
             "RegistryStatus::kSuccess",(Status *)&local_318,(Status *)&local_2c8);
  if ((internal)(undefined1)local_2f8.mCode == (internal)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_2f8.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2f8.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9df,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if ((long *)local_318._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_318._M_dataplus._M_p + 8))();
    }
  }
  _Var3._M_p = local_2f8.mMessage._M_dataplus._M_p;
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2f8.mMessage._M_dataplus._M_p != local_2f8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2f8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_2f8,"nwk.mXpan","xpan",(unsigned_long *)local_290,&local_238);
  if ((internal)(undefined1)local_2f8.mCode == (internal)0x0) {
    testing::Message::Message((Message *)&local_318);
    if (local_2f8.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2f8.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x9e0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2c8,(Message *)&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    if ((long *)local_318._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_318._M_dataplus._M_p + 8))();
    }
  }
  _Var3._M_p = local_2f8.mMessage._M_dataplus._M_p;
  if (local_2f8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2f8.mMessage._M_dataplus._M_p != local_2f8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2f8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var3._M_p);
  }
  if ((char *)local_280._M_allocated_capacity != local_270) {
    operator_delete((void *)local_280._M_allocated_capacity);
  }
  if (local_2b0._M_p != local_2a0) {
    operator_delete(local_2b0._M_p);
  }
  std::
  vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
  ::~vector(&local_1e8);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&local_1c8);
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAdd)
{
#define XPAN_1235 "0x1235"
#define XPAN_1236 "0x0000000000001236"

    TestContext ctx;
    InitContext(ctx);

    std::string brJson = "[\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2001,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": \"" XPAN_1235 "\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5670\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": \"" XPAN_1235 "\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5671\",\n\
        \"Port\": 2001,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net3\",\n\
        \"ExtendedPanId\": \"" XPAN_1236 "\",\n\
        \"DomainName\": \"dom3\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJson, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    BorderRouterArray brs;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllBorderRouters(brs), RegistryStatus::kSuccess);
    EXPECT_EQ(brs.size(), 3);

    NetworkArray nwks;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllNetworks(nwks), RegistryStatus::kSuccess);
    EXPECT_EQ(nwks.size(), 2);

    DomainArray doms;
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetAllDomains(doms), RegistryStatus::kSuccess);
    EXPECT_EQ(doms.size(), 2);

    Network  nwk;
    uint64_t xpan;
    EXPECT_EQ(utils::ParseInteger(xpan, "0x1235").GetCode(), ErrorCode::kNone);
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1235, nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mXpan, xpan);
    EXPECT_EQ(utils::ParseInteger(xpan, "0x0000000000001236").GetCode(), ErrorCode::kNone);
    EXPECT_EQ(ctx.mInterpreter.mRegistry->GetNetworkByXpan(0x1236, nwk), RegistryStatus::kSuccess);
    EXPECT_EQ(nwk.mXpan, xpan);
}